

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O1

type __thiscall
fmt::v5::internal::printf_width_handler<wchar_t>::operator()
          (printf_width_handler<wchar_t> *this,unsigned_long_long value)

{
  format_error *this_00;
  
  if (value >> 0x1f == 0) {
    return (type)value;
  }
  this_00 = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this_00,"number is too big");
  __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, unsigned>::type
      operator()(T value) {
    typedef typename internal::int_traits<T>::main_type UnsignedType;
    UnsignedType width = static_cast<UnsignedType>(value);
    if (internal::is_negative(value)) {
      spec_.align_ = ALIGN_LEFT;
      width = 0 - width;
    }
    unsigned int_max = std::numeric_limits<int>::max();
    if (width > int_max)
      FMT_THROW(format_error("number is too big"));
    return static_cast<unsigned>(width);
  }